

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  secp256k1_scalar *psVar6;
  secp256k1_scalar *psVar7;
  secp256k1_scalar *message;
  secp256k1_scalar *count;
  secp256k1_scalar *seckey;
  uint uVar8;
  ulong uVar9;
  secp256k1_ge *pubkey;
  secp256k1_ge *ge_00;
  secp256k1_context *psVar10;
  secp256k1_scalar *sigr;
  secp256k1_context *psVar11;
  byte bVar12;
  undefined1 *unaff_R12;
  secp256k1_ge *r;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  uchar *puVar13;
  uint uVar14;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  uchar pubkeyc [65];
  secp256k1_ge ge;
  secp256k1_scalar sStack_260;
  secp256k1_ge *psStack_238;
  secp256k1_ge *psStack_230;
  secp256k1_context *psStack_228;
  secp256k1_ge *psStack_220;
  secp256k1_ge *psStack_218;
  secp256k1_scalar sStack_210;
  ulong uStack_1e8;
  code *pcStack_1e0;
  char local_1d1;
  undefined8 local_1d0;
  undefined1 local_1c8 [65];
  uchar auStack_187 [7];
  secp256k1_ge *psStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  size_t local_138;
  int local_130;
  uint local_12c;
  uchar *local_128;
  ulong local_120;
  undefined1 local_118 [89];
  undefined8 uStack_bf;
  undefined8 local_b7;
  undefined8 uStack_af;
  undefined8 local_a7;
  undefined8 uStack_9f;
  secp256k1_ge local_88;
  secp256k1_ge *psVar15;
  
  local_138 = 3;
  local_1c8._60_4_ = xvalid;
  local_130 = yvalid;
  local_128 = input;
  do {
    local_118._65_8_ = *(undefined8 *)input;
    local_118._73_8_ = *(undefined8 *)(input + 8);
    local_118._81_8_ = *(undefined8 *)(input + 0x10);
    uStack_bf = *(undefined8 *)(input + 0x18);
    local_b7 = *(undefined8 *)(input + 0x20);
    uStack_af = *(undefined8 *)(input + 0x28);
    local_a7 = *(undefined8 *)(input + 0x30);
    uStack_9f = *(undefined8 *)(input + 0x38);
    local_1d1 = local_1c8._60_4_ != 0 && local_138 == 0x21;
    local_12c = (uint)(local_138 == 0x41) * 4;
    local_120 = (ulong)(local_138 == 0x41 || local_138 == 0x21);
    uVar9 = 0;
    do {
      output = (secp256k1_ge *)(local_1c8 + 0x40);
      pubkey = (secp256k1_ge *)0x0;
      local_118[0x40] = (char)uVar9;
      uVar8 = (uint)uVar9;
      uVar14 = input[0x3f] & 1 | 2;
      psVar15 = (secp256k1_ge *)(ulong)uVar14;
      if ((local_1c8._60_4_ == 0 || local_130 == 0) || (uVar8 & 4) != local_12c) {
        r = (secp256k1_ge *)0x0;
      }
      else {
        r = (secp256k1_ge *)
            CONCAT71((int7)((ulong)unaff_R12 >> 8),
                     ((uVar8 & 0xfb) == uVar14 || uVar8 == 4) & (byte)local_120);
      }
      bVar12 = (byte)r;
      psVar10 = CTX;
      if (((local_1d1 != '\0' && (uVar8 & 0xfe) == 2) | bVar12) != 1) {
        local_118._48_8_ = 0xfefefefefefefefe;
        local_118._56_8_ = 0xfefefefefefefefe;
        local_118._32_8_ = 0xfefefefefefefefe;
        local_118._40_8_ = 0xfefefefefefefefe;
        local_118._16_8_ = 0xfefefefefefefefe;
        local_118._24_8_ = 0xfefefefefefefefe;
        local_118._0_8_ = 0xfefefefefefefefe;
        local_118._8_8_ = 0xfefefefefefefefe;
        stack0xfffffffffffffe78 = (_func_void_char_ptr_void_ptr *)0x4d430001;
        r = (secp256k1_ge *)local_118;
        local_178._0_4_ = 0x40;
        local_178._4_4_ = 0;
        local_170 = 0;
        local_168 = 0;
        local_160 = 0;
        local_1c8._0_8_ = 0;
        pcStack_1e0 = (code *)0x16c7c0;
        ge_00 = r;
        psStack_180 = r;
        iVar4 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)r,local_118 + 0x40,local_138);
        psVar11 = CTX;
        if (iVar4 != 0) {
          pcStack_1e0 = (code *)0x16c8e1;
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_0016c8e1;
        }
        local_178._0_4_ = 0x40;
        local_178._4_4_ = 0;
        local_170 = 0;
        local_168 = 0;
        local_160 = 0;
        local_1c8._0_8_ = 0;
        unique0x1000084b = (CTX->illegal_callback).fn;
        psStack_180 = (secp256k1_ge *)(CTX->illegal_callback).data;
        if (secp256k1_context_static == CTX) {
          pcStack_1e0 = (code *)0x16c8b4;
          (*(CTX->illegal_callback).fn)
                    ("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
          psVar10 = CTX;
        }
        else {
          (CTX->illegal_callback).fn = counting_callback_fn;
          (psVar11->illegal_callback).data = local_1c8;
          psVar10 = psVar11;
        }
        ge_00 = &local_88;
        pcStack_1e0 = (code *)0x16c861;
        iVar4 = secp256k1_pubkey_load(psVar10,ge_00,(secp256k1_pubkey *)r);
        psVar11 = CTX;
        if (iVar4 != 0) goto LAB_0016c8eb;
        (CTX->illegal_callback).fn = stack0xfffffffffffffe78;
        (psVar11->illegal_callback).data = psStack_180;
        if (local_1c8._0_4_ == 1) goto LAB_0016c890;
LAB_0016c8f0:
        pcStack_1e0 = (code *)0x16c8f5;
        ec_pubkey_parse_pointtest_cold_3();
        puVar13 = input;
LAB_0016c8f5:
        input = puVar13;
        pcStack_1e0 = (code *)0x16c8fa;
        ec_pubkey_parse_pointtest_cold_4();
LAB_0016c8fa:
        pcStack_1e0 = (code *)0x16c8ff;
        ec_pubkey_parse_pointtest_cold_12();
LAB_0016c8ff:
        pcStack_1e0 = (code *)0x16c904;
        ec_pubkey_parse_pointtest_cold_6();
        output_00 = psVar15;
LAB_0016c904:
        pcStack_1e0 = (code *)0x16c909;
        ec_pubkey_parse_pointtest_cold_11();
LAB_0016c909:
        pcStack_1e0 = (code *)0x16c90e;
        ec_pubkey_parse_pointtest_cold_10();
LAB_0016c90e:
        pcStack_1e0 = (code *)0x16c913;
        ec_pubkey_parse_pointtest_cold_7();
        psVar15 = output_00;
LAB_0016c913:
        pcStack_1e0 = (code *)0x16c918;
        ec_pubkey_parse_pointtest_cold_8();
        output_00 = output;
LAB_0016c918:
        pcStack_1e0 = (code *)0x16c91d;
        ec_pubkey_parse_pointtest_cold_5();
LAB_0016c91d:
        pcStack_1e0 = test_sort_helper;
        ec_pubkey_parse_pointtest_cold_9();
        pcStack_1e0 = (code *)input;
        uStack_1e8 = uVar9;
        sigr = &sStack_210;
        if (count == (secp256k1_scalar *)0x0) {
          psStack_218 = (secp256k1_ge *)0x16c9b2;
          secp256k1_hsort(&sStack_210,0,8,secp256k1_ec_pubkey_sort_cmp,CTX);
        }
        else {
          psVar6 = (secp256k1_scalar *)0x0;
          do {
            sStack_210.d[(long)psVar6] =
                 (uint64_t)
                 ((&(psVar10->ecmult_gen_ctx).scalar_offset)[(ge_00->x).n[(long)psVar6] * 2 + -1].d
                 + 3);
            psVar6 = (secp256k1_scalar *)((long)psVar6->d + 1);
          } while (count != psVar6);
          psStack_218 = (secp256k1_ge *)0x16c96b;
          psVar6 = count;
          psVar11 = CTX;
          secp256k1_hsort(&sStack_210,(size_t)count,8,secp256k1_ec_pubkey_sort_cmp,CTX);
          psVar7 = (secp256k1_scalar *)0x0;
          do {
            message = (secp256k1_scalar *)sStack_210.d[(long)psVar7];
            lVar5 = 0;
            do {
              cVar1 = *(char *)((long)message->d + lVar5);
              psVar6 = (secp256k1_scalar *)CONCAT71((int7)((ulong)psVar6 >> 8),cVar1);
              if (cVar1 != *(char *)((long)(psVar10->ecmult_gen_ctx).scalar_offset.d + lVar5 + -8))
              {
                psStack_218 = (secp256k1_ge *)random_sign;
                test_sort_helper_cold_1();
                psStack_238 = r;
                psStack_230 = output_00;
                psStack_228 = psVar10;
                psStack_220 = psVar15;
                psStack_218 = pubkey;
                do {
                  testutil_random_scalar_order_test(&sStack_260);
                  iVar4 = secp256k1_ecdsa_sig_sign
                                    (&CTX->ecmult_gen_ctx,sigr,psVar6,seckey,message,&sStack_260,
                                     (int *)psVar11);
                } while (iVar4 == 0);
                return;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x40);
            psVar7 = (secp256k1_scalar *)((long)psVar7->d + 1);
            psVar10 = (secp256k1_context *)((psVar10->ecmult_gen_ctx).ge_offset.x.n + 3);
          } while (psVar7 != count);
        }
        return;
      }
      local_118._0_8_ = 0;
      local_118._8_8_ = 0;
      local_118._16_8_ = 0;
      local_118._24_8_ = 0;
      local_118._32_8_ = 0;
      local_118._40_8_ = 0;
      local_118._48_8_ = 0;
      local_118._56_8_ = 0;
      stack0xfffffffffffffe78 = (_func_void_char_ptr_void_ptr *)0x4d430001;
      puVar13 = (uchar *)0x0;
      pubkey = (secp256k1_ge *)local_118;
      local_178._0_4_ = 0x40;
      local_178._4_4_ = 0;
      local_170 = 0;
      local_168 = 0;
      local_160 = 0;
      local_1c8._0_8_ = 0;
      pcStack_1e0 = (code *)0x16c3c7;
      ge_00 = pubkey;
      psStack_180 = pubkey;
      iVar4 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)pubkey,local_118 + 0x40,local_138);
      input = puVar13;
      if (iVar4 == 0) {
LAB_0016c8e1:
        pcStack_1e0 = (code *)0x16c8e6;
        ec_pubkey_parse_pointtest_cold_14();
        puVar13 = input;
LAB_0016c8e6:
        pcStack_1e0 = (code *)0x16c8eb;
        ec_pubkey_parse_pointtest_cold_13();
        input = puVar13;
LAB_0016c8eb:
        pcStack_1e0 = (code *)0x16c8f0;
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_0016c8f0;
      }
      stack0xfffffffffffffe78 = (_func_void_char_ptr_void_ptr *)0x4d430005;
      local_178._0_4_ = 0x40;
      local_178._4_4_ = 0;
      local_170 = 0;
      local_168 = 0;
      local_160 = 0;
      local_1c8._48_8_ = 0x41;
      local_1c8._0_8_ = 0x4d430001;
      local_1c8._16_8_ = 0x41;
      local_1c8._24_8_ = 0;
      local_1c8._32_8_ = 0;
      local_1c8._40_8_ = 0;
      local_1d0 = 0;
      pcStack_1e0 = (code *)0x16c484;
      ge_00 = output;
      psVar10 = CTX;
      local_1c8._8_8_ = output;
      psStack_180 = pubkey;
      iVar4 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output,(size_t *)(local_1c8 + 0x30),(secp256k1_pubkey *)pubkey
                         ,0x102);
      input = local_128;
      if (iVar4 == 0) goto LAB_0016c8e6;
      local_1c8._0_8_ = 0x4d430005;
      local_1c8._8_8_ = output;
      local_1c8._16_8_ = local_1c8._48_8_;
      local_1c8._24_8_ = 0;
      local_1c8._32_8_ = 0;
      local_1c8._40_8_ = 0;
      uVar2 = (ulong)((long)psVar10 << 3) >> 0x33;
      uVar3 = (((long)psVar10 << 3 | (ulong)psVar10 >> 0x3d) << 0xd | uVar2) >> 3;
      psVar10 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
      local_1d0 = 0;
      pubkey = (secp256k1_ge *)0x0;
      if (local_1c8._48_8_ != 0x21) goto LAB_0016c8f5;
      lVar5 = 1;
      do {
        output_00 = output;
        if (local_1c8[lVar5 + 0x40] != local_118[lVar5 + 0x40]) goto LAB_0016c918;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x21);
      if ((local_138 == 0x21) && (local_1c8[0x40] != local_118[0x40])) goto LAB_0016c8fa;
      r = (secp256k1_ge *)local_118;
      if (bVar12 != 0) {
        if (local_1c8[0x40] != (char)uVar14) goto LAB_0016c8ff;
        pcStack_1e0 = (code *)0x16c562;
        ge_00 = &local_88;
        psVar10 = CTX;
        iVar4 = secp256k1_pubkey_load(CTX,&local_88,(secp256k1_pubkey *)r);
        output_00 = &local_88;
        if (iVar4 == 0) goto LAB_0016c904;
        local_118._48_8_ = 0;
        local_118._56_8_ = 0;
        local_118._32_8_ = 0;
        local_118._40_8_ = 0;
        local_118._16_8_ = 0;
        local_118._24_8_ = 0;
        local_118._0_8_ = 0;
        local_118._8_8_ = 0;
        local_1c8._0_8_ = 0x4d430001;
        local_1c8._16_8_ = 0x40;
        local_1c8._24_8_ = 0;
        local_1c8._32_8_ = 0;
        local_1c8._40_8_ = 0;
        output = (secp256k1_ge *)local_1c8;
        local_1d0 = 0;
        pcStack_1e0 = (code *)0x16c5e7;
        local_1c8._8_8_ = r;
        secp256k1_ge_to_storage((secp256k1_ge_storage *)r,&local_88);
        local_1c8._48_8_ = 0x41;
        local_1c8._0_8_ = 0x4d430001;
        output_00 = (secp256k1_ge *)(local_1c8 + 0x40);
        local_1c8._16_8_ = 0x41;
        local_1c8._24_8_ = 0;
        local_1c8._32_8_ = 0;
        local_1c8._40_8_ = 0;
        local_1d0 = 0;
        pcStack_1e0 = (code *)0x16c6a1;
        ge_00 = output_00;
        psVar10 = CTX;
        local_1c8._8_8_ = output_00;
        iVar4 = secp256k1_ec_pubkey_serialize
                          (CTX,(uchar *)output_00,(size_t *)(local_1c8 + 0x30),(secp256k1_pubkey *)r
                           ,2);
        if (iVar4 == 0) goto LAB_0016c909;
        local_1c8._0_8_ = 0x4d430005;
        local_1c8._8_8_ = output_00;
        local_1c8._16_8_ = local_1c8._48_8_;
        local_1c8._24_8_ = 0;
        local_1c8._32_8_ = 0;
        local_1c8._40_8_ = 0;
        uVar2 = (ulong)((long)psVar10 << 3) >> 0x33;
        uVar3 = (((long)psVar10 << 3 | (ulong)psVar10 >> 0x3d) << 0xd | uVar2) >> 3;
        psVar10 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
        local_1d0 = 0;
        if (local_1c8._48_8_ == 0x41) {
          psVar15 = output_00;
          if (local_1c8[0x40] != '\x04') goto LAB_0016c913;
          lVar5 = 0;
          do {
            if (auStack_187[lVar5] != input[lVar5]) goto LAB_0016c91d;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x40);
          goto LAB_0016c890;
        }
        goto LAB_0016c90e;
      }
LAB_0016c890:
      unaff_R12 = local_118;
      uVar9 = (ulong)(uVar8 + 1);
    } while (uVar8 + 1 != 0x100);
    local_138 = local_138 + 1;
    if (local_138 == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}